

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SHA1_Hash * __thiscall
ON_SubDExpandEdgesParameters::Hash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_SubDExpandEdgesParameters *this)

{
  uint i;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_9c;
  ON_SHA1 sha1;
  
  ON_SHA1::ON_SHA1(&sha1);
  ON_SHA1::AccumulateDouble(&sha1,this->m_constant_offset);
  ON_SHA1::AccumulateDouble(&sha1,(this->m_variable_offsets).m_t[0]);
  ON_SHA1::AccumulateDouble(&sha1,(this->m_variable_offsets).m_t[1]);
  local_9c = (this->m_face_color).field_0;
  i = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_9c);
  ON_SHA1::AccumulateInteger32(&sha1,i);
  ON_SHA1::AccumulateBytes(&sha1,&this->m_face_status,2);
  ON_SHA1::AccumulateInteger32(&sha1,(uint)this->m_face_style);
  ON_SHA1::Hash(__return_storage_ptr__,&sha1);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubDExpandEdgesParameters::Hash() const
{
  ON_SHA1 sha1;
  sha1.AccumulateDouble(ConstantOffset());
  sha1.AccumulateDouble(VariableOffset().m_t[0]);
  sha1.AccumulateDouble(VariableOffset().m_t[1]);
  sha1.AccumulateInteger32((unsigned int)FaceColor());
  sha1.AccumulateBytes(&m_face_status, sizeof(m_face_status));
  sha1.AccumulateInteger32((unsigned int)FaceStyle());
  return sha1.Hash();
}